

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O2

json_string * NumberToString::_itoa<long>(json_string *__return_storage_ptr__,long val)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  allocator local_29;
  char num_str_result [22];
  
  num_str_result[0x15] = '\0';
  pbVar3 = (byte *)(num_str_result + 0x14);
  uVar4 = -val;
  if (0 < val) {
    uVar4 = val;
  }
  do {
    pbVar2 = pbVar3;
    *pbVar2 = (byte)(uVar4 % 10) | 0x30;
    pbVar3 = pbVar2 + -1;
    bVar1 = 9 < uVar4;
    uVar4 = uVar4 / 10;
  } while (bVar1);
  if (val < 0) {
    *pbVar3 = 0x2d;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar3,&local_29);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar2,&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _itoa(T val) json_nothrow {		
	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
	   #else
		  json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
	   #endif
	   num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
	   json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];
	   bool negative;

	   START_MEM_SCOPE
	   long value = (long)val;
	   //first thing, check if it's negative, if so, make it positive
	   if (value < 0){
		  value = -value;
		  negative = true;
	   } else {
		  negative = false;
	   }

	   //create the string
	   do {
		  *runner-- = (json_char)(value % 10) + JSON_TEXT('0');
	   } while(value /= 10);
	   END_MEM_SCOPE

	   //if it's negative, add the negation
	   if (negative){
		  *runner = JSON_TEXT('-');
		  return json_string(runner);
	   }
	   return json_string(runner + 1);
    }